

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# day06a.cpp
# Opt level: O2

void day6a::run(void)

{
  ostream *poVar1;
  string sStack_48;
  string input;
  
  read_file_abi_cxx11_(&input,"input/day6.txt");
  std::operator<<((ostream *)&std::cout,"day6a ");
  recover_message(&sStack_48,&input);
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)&sStack_48);
  std::operator<<(poVar1,'\n');
  std::__cxx11::string::~string((string *)&sStack_48);
  std::__cxx11::string::~string((string *)&input);
  return;
}

Assistant:

void run() {
		std::string input = read_file("input/day6.txt");
		std::cout << "day6a ";
		std::cout << recover_message(input) << '\n';
		//std::cout << recover_message("eedadn\ndrvtee\neandsr\nraavrd\n"
		//	"atevrs\ntsrnev\nsdttsa\nrasrtv\n"
		//	"nssdts\nntnada\nsvetve\ntesnvt\n"
		//	"vntsnd\nvrdear\ndvrsen\nenarar") << '\n';
	}